

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvector.cpp
# Opt level: O2

UBool __thiscall icu_63::UVector::removeAll(UVector *this,UVector *other)

{
  int32_t index;
  int32_t i;
  long lVar1;
  UBool UVar2;
  
  UVar2 = '\0';
  for (lVar1 = 0; lVar1 < other->count; lVar1 = lVar1 + 1) {
    index = indexOf(this,other->elements[lVar1],0,'\0');
    if (-1 < index) {
      removeElementAt(this,index);
      UVar2 = '\x01';
    }
  }
  return UVar2;
}

Assistant:

UBool UVector::removeAll(const UVector& other) {
    UBool changed = FALSE;
    for (int32_t i=0; i<other.size(); ++i) {
        int32_t j = indexOf(other.elements[i]);
        if (j >= 0) {
            removeElementAt(j);
            changed = TRUE;
        }
    }
    return changed;
}